

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  int iVar1;
  long lVar2;
  sqlite3_file sVar3;
  sqlite3_file *psVar4;
  MemJournal *pMVar5;
  int iVar6;
  size_t __n;
  int iVar7;
  sqlite3_io_methods *psVar8;
  FileChunk *pFVar9;
  byte bVar10;
  MemJournal local_88;
  
  bVar10 = 0;
  lVar2 = (long)*(int *)((long)&pJfd[1].pMethods + 4);
  if ((lVar2 < 1) || (iAmt + iOfst <= lVar2)) {
    for (iVar1 = iAmt; 0 < iVar1; iVar1 = iVar1 - iVar7) {
      psVar8 = pJfd[5].pMethods;
      iVar6 = *(int *)&pJfd[1].pMethods;
      lVar2 = (long)pJfd[4].pMethods % (long)iVar6;
      iVar7 = iVar6 - (int)lVar2;
      if (iVar1 < iVar7) {
        iVar7 = iVar1;
      }
      sVar3.pMethods = psVar8;
      if (lVar2 == 0) {
        sVar3.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar6 + 8);
        if (sVar3.pMethods == (sqlite3_io_methods *)0x0) {
          return 0xc0a;
        }
        *(undefined8 *)sVar3.pMethods = 0;
        if (psVar8 == (sqlite3_io_methods *)0x0) {
          psVar8 = (sqlite3_io_methods *)(pJfd + 3);
        }
        *(sqlite3_io_methods **)psVar8 = sVar3.pMethods;
        pJfd[5].pMethods = sVar3.pMethods;
      }
      __n = (size_t)iVar7;
      memcpy((void *)((long)&(sVar3.pMethods)->xClose + lVar2),zBuf,__n);
      zBuf = (void *)((long)zBuf + __n);
      pJfd[4].pMethods = (sqlite3_io_methods *)((long)&(pJfd[4].pMethods)->iVersion + __n);
    }
    *(int *)&pJfd[2].pMethods = (int)iOfst + iAmt;
    iVar1 = 0;
  }
  else {
    psVar4 = pJfd;
    pMVar5 = &local_88;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      pMVar5->pMethod = psVar4->pMethods;
      psVar4 = psVar4 + 1;
      pMVar5 = (MemJournal *)&pMVar5->nChunkSize;
    }
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[10].pMethods = (sqlite3_io_methods *)0x0;
    iVar1 = (*(local_88.pVfs)->xOpen)
                      (local_88.pVfs,local_88.zJournal,pJfd,local_88.flags & 0x87f7f,(int *)0x0);
    if (iVar1 == 0) {
      lVar2 = 0;
      pFVar9 = local_88.pFirst;
      iVar6 = local_88.nChunkSize;
      while( true ) {
        if (pFVar9 == (FileChunk *)0x0) {
          memjrnlFreeChunks(&local_88);
          iVar1 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
          return iVar1;
        }
        if (local_88.endpoint.iOffset < iVar6 + lVar2) {
          iVar6 = (int)local_88.endpoint.iOffset - (int)lVar2;
        }
        iVar1 = (*pJfd->pMethods->xWrite)(pJfd,pFVar9->zChunk,iVar6,lVar2);
        if (iVar1 != 0) break;
        lVar2 = lVar2 + iVar6;
        pFVar9 = pFVar9->pNext;
      }
    }
    if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
      (*pJfd->pMethods->xClose)(pJfd);
    }
    pMVar5 = &local_88;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      pJfd->pMethods = pMVar5->pMethod;
      pMVar5 = (MemJournal *)((long)pMVar5 + ((ulong)bVar10 * -2 + 1) * 8);
      pJfd = pJfd + (ulong)bVar10 * -2 + 1;
    }
  }
  return iVar1;
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */ 
    assert( iOfst==p->endpoint.iOffset || iOfst==0 );
#ifdef SQLITE_ENABLE_ATOMIC_WRITE
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else
#else
    assert( iOfst>0 || p->pFirst==0 );
#endif
    {
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          p->endpoint.pChunk = pNew;
        }

        memcpy((u8*)p->endpoint.pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
      p->nSize = iAmt + iOfst;
    }
  }

  return SQLITE_OK;
}